

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O1

void __thiscall
bpwriter::format_with_padding(bpwriter *this,char *str,size_t bytes,size_t chars,fmtopts *opts)

{
  wchar_t wVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar2 = opts->width;
  iVar4 = (int)chars;
  iVar5 = iVar2 - iVar4;
  if (iVar5 == 0 || iVar2 < iVar4) {
    iVar5 = 0;
  }
  if ((opts->left_align == 0) && (iVar5 != 0)) {
    wVar1 = opts->pad;
    iVar6 = iVar4;
    if (iVar4 < iVar2) {
      iVar6 = iVar2;
    }
    iVar6 = iVar4 - iVar6;
    do {
      pcVar3 = CVmObjString::cons_append(this->str,this->dst,wVar1,0x40);
      this->dst = pcVar3;
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0);
  }
  pcVar3 = CVmObjString::cons_append(this->str,this->dst,str,bytes,0x40);
  this->dst = pcVar3;
  if ((opts->left_align != 0) && (iVar5 != 0)) {
    wVar1 = opts->pad;
    if (iVar2 <= iVar4) {
      iVar2 = iVar4;
    }
    iVar4 = iVar4 - iVar2;
    do {
      pcVar3 = CVmObjString::cons_append(this->str,this->dst,wVar1,0x40);
      this->dst = pcVar3;
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0);
  }
  return;
}

Assistant:

void format_with_padding(VMG_ const char *str,
                             size_t bytes, size_t chars,
                             const fmtopts &opts)
    {
        /* 
         *   Figure the amount of padding: if the width is larger than the
         *   string length (in characters), pad by the difference.  
         */
        int npad = (opts.width > (int)chars ? opts.width - chars : 0);

        /* if right-aligning, write the padding */
        if (!opts.left_align)
            putwch(opts.pad, npad);

        /* write the string */
        puts(str, bytes);

        /* if left-aligning, write the padding */
        if (opts.left_align)
            putwch(opts.pad, npad);
    }